

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Character.cpp
# Opt level: O3

void Handlers::Character_Request(Player *player,PacketReader *reader)

{
  PacketBuilder reply;
  string local_60;
  PacketBuilder local_40;
  
  PacketBuilder::PacketBuilder(&local_40,PACKET_CHARACTER,PACKET_REPLY,4);
  PacketBuilder::AddShort(&local_40,1000);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"OK","");
  PacketBuilder::AddString(&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  Player::Send(player,&local_40);
  PacketBuilder::~PacketBuilder(&local_40);
  return;
}

Assistant:

void Character_Request(Player *player, PacketReader &reader)
{
	(void)reader;

	PacketBuilder reply(PACKET_CHARACTER, PACKET_REPLY, 4);
	reply.AddShort(1000); // CreateID?
	reply.AddString("OK");

	player->Send(reply);
}